

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

int32_t __thiscall
icu_63::Calendar::fieldDifference
          (Calendar *this,UDate targetMs,UCalendarDateFields field,UErrorCode *ec)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double millis;
  double dVar5;
  
  uVar4 = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    millis = getTimeInMillis(this,ec);
    if (targetMs <= millis) {
      uVar2 = 0;
      if (millis <= targetMs) {
LAB_001f8bed:
        setTimeInMillis(this,millis,ec);
        (*(this->super_UObject)._vptr_UObject[7])(this,field,(ulong)uVar2,ec);
        uVar4 = 0;
        if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
          uVar4 = uVar2;
        }
      }
      else {
        if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
          uVar3 = 0xffffffff;
          uVar2 = 0;
          do {
            uVar4 = uVar3;
            setTimeInMillis(this,millis,ec);
            (*(this->super_UObject)._vptr_UObject[7])(this,field,(ulong)uVar4,ec);
            dVar5 = getTimeInMillis(this,ec);
            if ((dVar5 == targetMs) && (!NAN(dVar5) && !NAN(targetMs))) {
              return uVar4;
            }
            uVar3 = uVar4;
            if (dVar5 < targetMs) break;
            uVar3 = uVar4 * 2;
            uVar2 = uVar4;
            if (uVar3 == 0) {
              *ec = U_ILLEGAL_ARGUMENT_ERROR;
              uVar3 = 0;
              break;
            }
          } while (*ec < U_ILLEGAL_ARGUMENT_ERROR);
        }
        else {
          uVar2 = 0;
          uVar3 = 0xffffffff;
        }
        do {
          if (((int)(uVar2 - uVar3) < 2) || (U_ZERO_ERROR < *ec)) goto LAB_001f8bed;
          uVar4 = (int)(uVar3 - uVar2) / 2 + uVar2;
          setTimeInMillis(this,millis,ec);
          (*(this->super_UObject)._vptr_UObject[7])(this,field,(ulong)uVar4,ec);
          dVar5 = getTimeInMillis(this,ec);
          uVar1 = uVar4;
          if (targetMs <= dVar5) {
            uVar2 = uVar4;
            uVar1 = uVar3;
          }
          uVar3 = uVar1;
        } while ((dVar5 != targetMs) || (NAN(dVar5) || NAN(targetMs)));
      }
    }
    else {
      if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
        uVar3 = 1;
        uVar2 = 0;
        do {
          uVar4 = uVar3;
          setTimeInMillis(this,millis,ec);
          (*(this->super_UObject)._vptr_UObject[7])(this,field,(ulong)uVar4,ec);
          dVar5 = getTimeInMillis(this,ec);
          if ((dVar5 == targetMs) && (!NAN(dVar5) && !NAN(targetMs))) {
            return uVar4;
          }
          uVar3 = uVar4;
          if (targetMs < dVar5) break;
          if (uVar4 == 0x7fffffff) {
            *ec = U_ILLEGAL_ARGUMENT_ERROR;
            uVar3 = 0x7fffffff;
            break;
          }
          uVar3 = uVar4 * 2;
          if (0x7ffffffe < uVar4 * 2) {
            uVar3 = 0x7fffffff;
          }
          uVar2 = uVar4;
        } while (*ec < U_ILLEGAL_ARGUMENT_ERROR);
      }
      else {
        uVar2 = 0;
        uVar3 = 1;
      }
      do {
        if (((int)(uVar3 - uVar2) < 2) || (U_ZERO_ERROR < *ec)) goto LAB_001f8bed;
        uVar4 = (uVar3 - uVar2 >> 1) + uVar2;
        setTimeInMillis(this,millis,ec);
        (*(this->super_UObject)._vptr_UObject[7])(this,field,(ulong)uVar4,ec);
        dVar5 = getTimeInMillis(this,ec);
        uVar1 = uVar4;
        if (dVar5 <= targetMs) {
          uVar2 = uVar4;
          uVar1 = uVar3;
        }
        uVar3 = uVar1;
      } while ((dVar5 != targetMs) || (NAN(dVar5) || NAN(targetMs)));
    }
  }
  return uVar4;
}

Assistant:

int32_t Calendar::fieldDifference(UDate targetMs, UCalendarDateFields field, UErrorCode& ec) {
    if (U_FAILURE(ec)) return 0;
    int32_t min = 0;
    double startMs = getTimeInMillis(ec);
    // Always add from the start millis.  This accomodates
    // operations like adding years from February 29, 2000 up to
    // February 29, 2004.  If 1, 1, 1, 1 is added to the year
    // field, the DOM gets pinned to 28 and stays there, giving an
    // incorrect DOM difference of 1.  We have to add 1, reset, 2,
    // reset, 3, reset, 4.
    if (startMs < targetMs) {
        int32_t max = 1;
        // Find a value that is too large
        while (U_SUCCESS(ec)) {
            setTimeInMillis(startMs, ec);
            add(field, max, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return max;
            } else if (ms > targetMs) {
                break;
            } else if (max < INT32_MAX) {
                min = max;
                max <<= 1;
                if (max < 0) {
                    max = INT32_MAX;
                }
            } else {
                // Field difference too large to fit into int32_t
#if defined (U_DEBUG_CAL)
                fprintf(stderr, "%s:%d: ILLEGAL ARG because field %s's max too large for int32_t\n",
                    __FILE__, __LINE__, fldName(field));
#endif
                ec = U_ILLEGAL_ARGUMENT_ERROR;
            }
        }
        // Do a binary search
        while ((max - min) > 1 && U_SUCCESS(ec)) {
            int32_t t = min + (max - min)/2; // make sure intermediate values don't exceed INT32_MAX
            setTimeInMillis(startMs, ec);
            add(field, t, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return t;
            } else if (ms > targetMs) {
                max = t;
            } else {
                min = t;
            }
        }
    } else if (startMs > targetMs) {
        int32_t max = -1;
        // Find a value that is too small
        while (U_SUCCESS(ec)) {
            setTimeInMillis(startMs, ec);
            add(field, max, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return max;
            } else if (ms < targetMs) {
                break;
            } else {
                min = max;
                max <<= 1;
                if (max == 0) {
                    // Field difference too large to fit into int32_t
#if defined (U_DEBUG_CAL)
                    fprintf(stderr, "%s:%d: ILLEGAL ARG because field %s's max too large for int32_t\n",
                        __FILE__, __LINE__, fldName(field));
#endif
                    ec = U_ILLEGAL_ARGUMENT_ERROR;
                }
            }
        }
        // Do a binary search
        while ((min - max) > 1 && U_SUCCESS(ec)) {
            int32_t t = min + (max - min)/2; // make sure intermediate values don't exceed INT32_MAX
            setTimeInMillis(startMs, ec);
            add(field, t, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return t;
            } else if (ms < targetMs) {
                max = t;
            } else {
                min = t;
            }
        }
    }
    // Set calendar to end point
    setTimeInMillis(startMs, ec);
    add(field, min, ec);

    /* Test for buffer overflows */
    if(U_FAILURE(ec)) {
        return 0;
    }
    return min;
}